

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::toLower(string *__return_storage_ptr__,string *s)

{
  string *s_local;
  string *lc;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  toLowerInPlace(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string toLower( std::string const& s ) {
        std::string lc = s;
        toLowerInPlace( lc );
        return lc;
    }